

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O0

void inflate_fast(z_streamp strm,uint start)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  unsigned_long uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  code *pcVar17;
  ulong uVar18;
  uchar *puVar19;
  code *pcVar20;
  int in_ESI;
  long *in_RDI;
  uchar *end;
  uchar *beg;
  uchar *out;
  uchar *last;
  uchar *in;
  inflate_state *state;
  int local_c0;
  int local_b8;
  long local_98;
  uint local_8c;
  uint local_88;
  undefined4 local_84;
  uint local_64;
  ulong local_60;
  uchar *from;
  uint dist;
  uint len;
  uint op;
  code this;
  uint dmask;
  uint lmask;
  code *dcode;
  code *lcode;
  uint bits;
  unsigned_long hold;
  uchar *window;
  uint write;
  uint whave;
  uint wsize;
  
  puVar5 = (undefined4 *)in_RDI[7];
  hold = *in_RDI - 1;
  uVar16 = hold + ((int)in_RDI[1] - 5);
  lcode = (code *)(in_RDI[3] + -1);
  lVar10 = in_RDI[4];
  iVar9 = (int)lcode;
  pcVar17 = (code *)(&lcode->op + ((int)in_RDI[4] - 0x101));
  iVar15 = puVar5[0xd];
  uVar1 = puVar5[0xe];
  uVar2 = puVar5[0xf];
  lVar6 = *(long *)(puVar5 + 0x10);
  local_60 = *(ulong *)(puVar5 + 0x12);
  local_64 = puVar5[0x14];
  lVar7 = *(long *)(puVar5 + 0x18);
  lVar8 = *(long *)(puVar5 + 0x1a);
  uVar3 = puVar5[0x1c];
  uVar4 = puVar5[0x1d];
LAB_001d4e7a:
  if (local_64 < 0xf) {
    local_60 = ((ulong)*(byte *)(hold + 2) << ((byte)local_64 + 8 & 0x3f)) +
               ((ulong)*(byte *)(hold + 1) << ((byte)local_64 & 0x3f)) + local_60;
    local_64 = local_64 + 0x10;
    hold = hold + 2;
  }
  local_84 = *(uint *)(lVar7 + (local_60 & (1 << ((byte)uVar3 & 0x1f)) - 1) * 4);
  while( true ) {
    local_60 = local_60 >> (local_84._1_1_ & 0x3f);
    local_64 = local_64 - local_84._1_1_;
    if ((local_84 & 0xff) == 0) break;
    if ((local_84 & 0x10) != 0) {
      local_8c = (uint)local_84._2_2_;
      local_84 = local_84 & 0xf;
      if (local_84 != 0) {
        if (local_64 < local_84) {
          local_60 = ((ulong)*(byte *)(hold + 1) << ((byte)local_64 & 0x3f)) + local_60;
          local_64 = local_64 + 8;
          hold = hold + 1;
        }
        local_8c = ((uint)local_60 & (1 << (sbyte)local_84) - 1U) + local_8c;
        local_60 = local_60 >> (sbyte)local_84;
        local_64 = local_64 - local_84;
      }
      if (local_64 < 0xf) {
        local_60 = ((ulong)*(byte *)(hold + 2) << ((byte)local_64 + 8 & 0x3f)) +
                   ((ulong)*(byte *)(hold + 1) << ((byte)local_64 & 0x3f)) + local_60;
        local_64 = local_64 + 0x10;
        hold = hold + 2;
      }
      local_84 = *(uint *)(lVar8 + (local_60 & (1 << ((byte)uVar4 & 0x1f)) - 1) * 4);
      goto LAB_001d507c;
    }
    if ((local_84 & 0x40) != 0) {
      if ((local_84 & 0x20) == 0) {
        in_RDI[6] = (long)"invalid literal/length code";
        *puVar5 = 0x1b;
      }
      else {
        *puVar5 = 0xb;
      }
      goto LAB_001d572c;
    }
    local_84 = *(uint *)(lVar7 + ((ulong)local_84._2_2_ +
                                 (local_60 & (1 << ((byte)local_84 & 0x1f)) - 1)) * 4);
  }
  lcode->bits = (uchar)(local_84 >> 0x10);
  pcVar20 = (code *)&lcode->bits;
  goto LAB_001d56fc;
LAB_001d507c:
  local_60 = local_60 >> (local_84._1_1_ & 0x3f);
  uVar13 = local_64 - local_84._1_1_;
  local_64 = uVar13;
  if ((local_84 & 0x10) != 0) goto code_r0x001d50bf;
  if ((local_84 & 0x40) != 0) {
    in_RDI[6] = (long)"invalid distance code";
    *puVar5 = 0x1b;
    goto LAB_001d572c;
  }
  local_84 = *(uint *)(lVar8 + ((ulong)local_84._2_2_ +
                               (local_60 & (1 << ((byte)local_84 & 0x1f)) - 1)) * 4);
  goto LAB_001d507c;
code_r0x001d50bf:
  uVar14 = local_84 & 0xf;
  uVar12 = hold;
  if (uVar13 < uVar14) {
    local_60 = ((ulong)*(byte *)(hold + 1) << ((byte)uVar13 & 0x3f)) + local_60;
    local_64 = uVar13 + 8;
    uVar12 = hold + 1;
    if (local_64 < uVar14) {
      local_60 = ((ulong)*(byte *)(hold + 2) << ((byte)local_64 & 0x3f)) + local_60;
      local_64 = uVar13 + 0x10;
      uVar12 = hold + 2;
    }
  }
  hold = uVar12;
  uVar13 = ((uint)local_60 & (1 << (sbyte)uVar14) - 1U) + (uint)local_84._2_2_;
  local_60 = local_60 >> (sbyte)uVar14;
  local_64 = local_64 - uVar14;
  local_88 = (int)lcode - (iVar9 - (in_ESI - (int)lVar10));
  if (local_88 < uVar13) {
    local_88 = uVar13 - local_88;
    if (uVar1 < local_88) {
      in_RDI[6] = (long)"invalid distance too far back";
      *puVar5 = 0x1b;
      goto LAB_001d572c;
    }
    local_98 = lVar6 + -1;
    if (uVar2 == 0) {
      local_98 = local_98 + (ulong)(iVar15 - local_88);
      if (local_88 < local_8c) {
        local_8c = local_8c - local_88;
        do {
          puVar19 = &lcode->bits;
          lcode->bits = *(uchar *)(local_98 + 1);
          local_88 = local_88 - 1;
          local_98 = local_98 + 1;
          lcode = (code *)puVar19;
        } while (local_88 != 0);
        local_98 = (long)puVar19 - (ulong)uVar13;
      }
    }
    else if (uVar2 < local_88) {
      local_98 = local_98 + (ulong)((iVar15 + uVar2) - local_88);
      local_88 = local_88 - uVar2;
      if (local_88 < local_8c) {
        local_8c = local_8c - local_88;
        do {
          puVar19 = &lcode->bits;
          lcode->bits = *(uchar *)(local_98 + 1);
          local_88 = local_88 - 1;
          local_98 = local_98 + 1;
          lcode = (code *)puVar19;
        } while (local_88 != 0);
        local_98 = lVar6 + -1;
        if (uVar2 < local_8c) {
          local_8c = local_8c - uVar2;
          local_88 = uVar2;
          do {
            puVar19 = &lcode->bits;
            lcode->bits = *(uchar *)(local_98 + 1);
            local_88 = local_88 - 1;
            local_98 = local_98 + 1;
            lcode = (code *)puVar19;
          } while (local_88 != 0);
          local_98 = (long)puVar19 - (ulong)uVar13;
        }
      }
    }
    else {
      local_98 = local_98 + (ulong)(uVar2 - local_88);
      if (local_88 < local_8c) {
        local_8c = local_8c - local_88;
        do {
          puVar19 = &lcode->bits;
          lcode->bits = *(uchar *)(local_98 + 1);
          local_88 = local_88 - 1;
          local_98 = local_98 + 1;
          lcode = (code *)puVar19;
        } while (local_88 != 0);
        local_98 = (long)puVar19 - (ulong)uVar13;
      }
    }
    for (; 2 < local_8c; local_8c = local_8c - 3) {
      lcode->bits = *(uchar *)(local_98 + 1);
      *(undefined1 *)&lcode->val = *(undefined1 *)(local_98 + 2);
      *(undefined1 *)((long)&lcode->val + 1) = *(undefined1 *)(local_98 + 3);
      local_98 = local_98 + 3;
      lcode = (code *)((long)&lcode->val + 1);
    }
    pcVar20 = lcode;
    if (local_8c != 0) {
      lcode->bits = *(uchar *)(local_98 + 1);
      pcVar20 = (code *)&lcode->bits;
      if (1 < local_8c) {
        *(undefined1 *)&lcode->val = *(undefined1 *)(local_98 + 2);
        pcVar20 = (code *)&lcode->val;
      }
    }
  }
  else {
    lVar11 = (long)lcode - (ulong)uVar13;
    pcVar20 = lcode;
    do {
      lcode = pcVar20;
      local_98 = lVar11;
      lcode->bits = *(uchar *)(local_98 + 1);
      *(undefined1 *)&lcode->val = *(undefined1 *)(local_98 + 2);
      pcVar20 = (code *)((long)&lcode->val + 1);
      *(undefined1 *)((long)&lcode->val + 1) = *(undefined1 *)(local_98 + 3);
      local_8c = local_8c - 3;
      lVar11 = local_98 + 3;
    } while (2 < local_8c);
    if (local_8c != 0) {
      lcode[1].op = *(uchar *)(local_98 + 4);
      pcVar20 = lcode + 1;
      if (1 < local_8c) {
        lcode[1].bits = *(uchar *)(local_98 + 5);
        pcVar20 = (code *)&lcode[1].bits;
      }
    }
  }
LAB_001d56fc:
  lcode = pcVar20;
  if (uVar16 <= hold || pcVar17 <= lcode) {
LAB_001d572c:
    uVar18 = hold - (local_64 >> 3);
    iVar15 = local_64 + (local_64 >> 3) * -8;
    *in_RDI = uVar18 + 1;
    in_RDI[3] = (long)&lcode->bits;
    if (uVar18 < uVar16) {
      local_b8 = (int)uVar16 - (int)uVar18;
    }
    else {
      local_b8 = -((int)uVar18 - (int)uVar16);
    }
    local_b8 = local_b8 + 5;
    *(int *)(in_RDI + 1) = local_b8;
    if (lcode < pcVar17) {
      local_c0 = (int)pcVar17 - (int)lcode;
    }
    else {
      local_c0 = -((int)lcode - (int)pcVar17);
    }
    local_c0 = local_c0 + 0x101;
    *(int *)(in_RDI + 4) = local_c0;
    *(ulong *)(puVar5 + 0x12) = (1 << ((byte)iVar15 & 0x1f)) - 1 & local_60;
    puVar5[0x14] = iVar15;
    return;
  }
  goto LAB_001d4e7a;
}

Assistant:

void inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned write;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code this;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    write = state->write;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
        }
        this = lcode[hold & lmask];
      dolen:
        op = (unsigned)(this.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(this.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, this.val >= 0x20 && this.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", this.val));
            PUP(out) = (unsigned char)(this.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(this.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
            }
            this = dcode[hold & dmask];
          dodist:
            op = (unsigned)(this.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(this.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(this.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        strm->msg = (char *)"invalid distance too far back";
                        state->mode = BAD;
                        break;
                    }
                    from = window - OFF;
                    if (write == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (write < op) {      /* wrap around window */
                        from += wsize + write - op;
                        op -= write;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (write < len) {  /* some from start of window */
                                op = write;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += write - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                this = dcode[this.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            this = lcode[this.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}